

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::MessageBuilder::~MessageBuilder(MessageBuilder *this)

{
  MessageBuilder *this_local;
  
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_stream);
  MessageInfo::~MessageInfo(&this->m_info);
  return;
}

Assistant:

MessageBuilder( std::string const& macroName,
                        SourceLineInfo const& lineInfo,
                        ResultWas::OfType type )
        : m_info( macroName, lineInfo, type )
        {}